

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImathVec.h
# Opt level: O0

float * __thiscall Imath_3_2::Vec4<float>::operator[](Vec4<float> *this,int i)

{
  int i_local;
  Vec4<float> *this_local;
  
  return &this->x + i;
}

Assistant:

IMATH_HOSTDEVICE constexpr inline const T&
Vec4<T>::operator[] (int i) const IMATH_NOEXCEPT
{
#ifdef __cpp_if_consteval
    if consteval
    {
        return (i == 0) ? x : ((i == 1) ? y : ((i == 2) ? z : w));
    }
    else
    {
        return reinterpret_cast<const T*> (this)[i];
    }
#else
    return reinterpret_cast<const T*> (this)[i];
#endif
}